

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::erase
          (QPodArrayOps<QToolBarAreaLayoutItem> *this,QToolBarAreaLayoutItem *b,qsizetype n)

{
  QToolBarAreaLayoutItem *__src;
  QToolBarAreaLayoutItem *pQVar1;
  long in_RDX;
  QToolBarAreaLayoutItem *in_RSI;
  long in_RDI;
  QToolBarAreaLayoutItem *e;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  pQVar1 = QArrayDataPointer<QToolBarAreaLayoutItem>::begin
                     ((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6fa743);
  if ((in_RSI == pQVar1) &&
     (pQVar1 = QArrayDataPointer<QToolBarAreaLayoutItem>::end(in_stack_ffffffffffffffb0),
     __src != pQVar1)) {
    *(QToolBarAreaLayoutItem **)(in_RDI + 8) = __src;
  }
  else {
    pQVar1 = QArrayDataPointer<QToolBarAreaLayoutItem>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar1) {
      pQVar1 = QArrayDataPointer<QToolBarAreaLayoutItem>::end
                         ((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_RSI);
      memmove(in_RSI,__src,(((long)pQVar1 - (long)__src) / 0x18) * 0x18);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }